

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fct_nlist__init2(fct_nlist_t *list,size_t start_sz)

{
  void **ppvVar1;
  
  if (list == (fct_nlist_t *)0x0) {
    __assert_fail("list != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x2f7
                  ,"int fct_nlist__init2(fct_nlist_t *, size_t)");
  }
  if (start_sz == 0) {
    list->itm_list = (void **)0x0;
  }
  else {
    ppvVar1 = (void **)malloc(start_sz * 8);
    list->itm_list = ppvVar1;
    if (ppvVar1 == (void **)0x0) {
      return 0;
    }
  }
  list->avail_itm_num = start_sz;
  list->used_itm_num = 0;
  return 1;
}

Assistant:

static int
fct_nlist__init2(fct_nlist_t *list, size_t start_sz)
{
    FCT_ASSERT( list != NULL );
    if ( start_sz == 0 )
    {
        list->itm_list = NULL;
    }
    else
    {
        list->itm_list = (void**)malloc(sizeof(void*)*start_sz);
        if ( list->itm_list == NULL )
        {
            return 0;
        }
    }
    /* If these are both 0, then they are equal and that means
    that the first append operation will allocate memory. The beauty
    here is that if the list remains empty, then we save a malloc.
    Empty lists are relatively common in FCT (consider an error list). */
    list->avail_itm_num = start_sz;
    list->used_itm_num =0;
    return 1;
}